

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diffuse.cpp
# Opt level: O1

Spectrum * __thiscall
phyr::DiffuseAreaLight::sample_li
          (Spectrum *__return_storage_ptr__,DiffuseAreaLight *this,Interaction *ref,Point2f *u,
          Vector3f *wi,double *pdf,VisibilityTester *vis)

{
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  byte bVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Interaction pShape;
  double local_158;
  double dStack_150;
  double local_148;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double local_98 [13];
  
  bVar4 = 0;
  (*((this->shape).super___shared_ptr<phyr::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Shape
    [9])(&local_158);
  if ((*pdf != 0.0) || (NAN(*pdf))) {
    dVar8 = local_148 - (ref->p).z;
    dVar6 = local_158 - (ref->p).x;
    dVar7 = dStack_150 - (ref->p).y;
    dVar5 = dVar8 * dVar8 + dVar6 * dVar6 + dVar7 * dVar7;
    if ((dVar5 != 0.0) || (NAN(dVar5))) {
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      dVar5 = 1.0 / dVar5;
      wi->x = dVar6 * dVar5;
      wi->y = dVar7 * dVar5;
      wi->z = dVar8 * dVar5;
      pdVar2 = &local_f8;
      for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
        *pdVar2 = (ref->p).x;
        ref = (Interaction *)((long)ref + (ulong)bVar4 * -0x10 + 8);
        pdVar2 = pdVar2 + (ulong)bVar4 * -2 + 1;
      }
      pdVar2 = &local_158;
      pdVar3 = local_98;
      for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
        *pdVar3 = *pdVar2;
        pdVar2 = pdVar2 + (ulong)bVar4 * -2 + 1;
        pdVar3 = pdVar3 + (ulong)bVar4 * -2 + 1;
      }
      memcpy(vis,&local_f8,0xc0);
      local_e8 = -wi->z;
      local_f8 = -wi->x;
      dStack_f0 = -wi->y;
      (*(this->super_AreaLight).super_Light._vptr_Light[9])
                (__return_storage_ptr__,this,&local_158,&local_f8);
      return __return_storage_ptr__;
    }
  }
  *pdf = 0.0;
  memset(__return_storage_ptr__,0,0x1e0);
  return __return_storage_ptr__;
}

Assistant:

Spectrum DiffuseAreaLight::sample_li(const Interaction& ref, const Point2f& u,
                                     Vector3f* wi, Real* pdf,
                                     VisibilityTester* vis) const {
    Interaction pShape = shape->sample(ref, u, pdf);
    if (*pdf == 0 || (pShape.p - ref.p).lengthSquared() == 0) {
        *pdf = 0;
        return 0.f;
    }
    *wi = normalize(pShape.p - ref.p);
    *vis = VisibilityTester(ref, pShape);
    return l(pShape, -*wi);
}